

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogExecution.cpp
# Opt level: O2

void __thiscall wasm::LogExecution::visitModule(LogExecution *this,Module *curr)

{
  char *pcVar1;
  Function *pFVar2;
  HeapType type;
  uintptr_t uVar3;
  char *pcVar4;
  size_t sVar5;
  pointer puVar6;
  Name name;
  HeapType local_60;
  _Vector_base<wasm::Type,_std::allocator<wasm::Type>_> local_58;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> local_38;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> import;
  
  type.id = DAT_01175b78.id;
  pcVar1 = LOGGER;
  HeapType::HeapType(&local_60,(Signature)ZEXT816(2));
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  name.super_IString.str._M_str = pcVar1;
  name.super_IString.str._M_len = (size_t)&local_38;
  Builder::makeFunction
            (name,type,(vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_60.id,
             (Expression *)&local_58);
  std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base(&local_58);
  IString::IString((IString *)&local_58,"");
  pcVar4 = DAT_01174c48;
  pcVar1 = (this->loggerModule).str._M_str;
  if ((pointer)pcVar1 == local_58._M_impl.super__Vector_impl_data._M_finish) {
    puVar6 = (curr->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (puVar6 == (curr->functions).
                    super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) goto LAB_00a79e29;
      pFVar2 = (puVar6->_M_t).
               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
               super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      pcVar1 = *(char **)((long)&(pFVar2->super_Importable).module + 8);
      puVar6 = puVar6 + 1;
    } while (pcVar1 != DAT_01174c48 || pcVar1 == (char *)0x0);
    pcVar1 = *(char **)((long)&(pFVar2->super_Importable).module + 8);
    *(undefined8 *)
     ((long)local_38._M_t.
            super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
            super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x18) =
         (pFVar2->super_Importable).module.super_IString.str._M_len;
    *(char **)((long)local_38._M_t.
                     super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                     super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x20) = pcVar1;
LAB_00a79e29:
    if (*(long *)((long)local_38._M_t.
                        super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                        .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x20) != 0)
    goto LAB_00a79e30;
    puVar6 = (curr->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      sVar5 = ENV;
      if (puVar6 == (curr->functions).
                    super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) goto LAB_00a79dd3;
      pFVar2 = (puVar6->_M_t).
               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
               super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      puVar6 = puVar6 + 1;
    } while (*(char **)((long)&(pFVar2->super_Importable).module + 8) == (char *)0x0);
    pcVar1 = *(char **)((long)&(pFVar2->super_Importable).module + 8);
    *(undefined8 *)
     ((long)local_38._M_t.
            super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
            super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x18) =
         (pFVar2->super_Importable).module.super_IString.str._M_len;
    *(char **)((long)local_38._M_t.
                     super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                     super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x20) = pcVar1;
    sVar5 = ENV;
    if (*(long *)((long)local_38._M_t.
                        super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                        .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x20) != 0)
    goto LAB_00a79e30;
  }
  else {
    pcVar4 = pcVar1;
    sVar5 = (this->loggerModule).str._M_len;
  }
LAB_00a79dd3:
  *(size_t *)
   ((long)local_38._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
          _M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
          super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x18) = sVar5;
  *(char **)((long)local_38._M_t.
                   super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                   super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x20) = pcVar4;
LAB_00a79e30:
  uVar3 = DAT_01175b78.id;
  *(char **)((long)local_38._M_t.
                   super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                   super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x28) = LOGGER;
  *(uintptr_t *)
   ((long)local_38._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
          _M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
          super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x30) = uVar3;
  Module::addFunction(curr,&local_38);
  std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr(&local_38);
  return;
}

Assistant:

void visitModule(Module* curr) {
    // Add the import
    auto import =
      Builder::makeFunction(LOGGER, Signature(Type::i32, Type::none), {});

    if (loggerModule != "") {
      import->module = loggerModule;
    } else {
      // Import the log function from import "env" if the module
      // imports other functions from that name.
      for (auto& func : curr->functions) {
        if (func->imported() && func->module == ENV) {
          import->module = func->module;
          break;
        }
      }

      // If not, then pick the import name of the first function we find.
      if (!import->module) {
        for (auto& func : curr->functions) {
          if (func->imported()) {
            import->module = func->module;
            break;
          }
        }
      }

      // If no function was found, use ENV.
      if (!import->module) {
        import->module = ENV;
      }
    }

    import->base = LOGGER;
    curr->addFunction(std::move(import));
  }